

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

void __thiscall trimesh::mscomplex_t::connect_cps(mscomplex_t *this,int p,int q)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  reference pvVar6;
  size_type sVar7;
  size_type sVar8;
  int __c;
  int __c_00;
  uint local_54c;
  _Base_ptr local_548;
  uint local_540;
  undefined1 local_539;
  string local_538 [32];
  stringstream local_518 [8];
  stringstream ss_2;
  ostream local_508 [380];
  uint local_38c;
  uint local_388;
  undefined1 local_381;
  string local_380 [32];
  stringstream local_360 [8];
  stringstream ss_1;
  ostream local_350 [383];
  undefined1 local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  uint local_18;
  uint local_14;
  int q_local;
  int p_local;
  mscomplex_t *this_local;
  
  local_18 = q;
  local_14 = p;
  _q_local = this;
  order_pr_by_cp_index(this,(int *)&local_14,(int *)&local_18);
  pcVar2 = index(this,(char *)(ulong)local_14,__c);
  pcVar3 = index(this,(char *)(ulong)local_18,__c_00);
  if ((int)pcVar2 != (int)pcVar3 + 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = std::operator<<(local_190,"Failed to assert condition ");
    poVar4 = std::operator<<(poVar4,"index(p) == index(q)+1");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"at (");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,"connect_cps");
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11a);
    std::operator<<(poVar4,") \n ");
    local_1d1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_not_paired(this,local_14);
  if ((bVar1) && (bVar1 = is_not_paired(this,local_18), bVar1)) {
    pvVar6 = std::
             vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->m_des_conn,(long)(int)local_14);
    local_388 = local_18;
    sVar7 = std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
            count(pvVar6,&local_388);
    pvVar6 = std::
             vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->m_asc_conn,(long)(int)local_18);
    local_38c = local_14;
    sVar8 = std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
            count(pvVar6,&local_38c);
    if (sVar7 != sVar8) {
      std::__cxx11::stringstream::stringstream(local_518);
      poVar4 = std::operator<<(local_508,"Failed to assert condition ");
      poVar4 = std::operator<<(poVar4,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"at (");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = std::operator<<(poVar4,"connect_cps");
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11c);
      std::operator<<(poVar4,") \n ");
      local_539 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar5,local_538);
      local_539 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar6 = std::
             vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->m_des_conn,(long)(int)local_14);
    local_540 = local_18;
    local_548 = (_Base_ptr)
                std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert(pvVar6,&local_540);
    pvVar6 = std::
             vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](this->m_asc_conn,(long)(int)local_18);
    local_54c = local_14;
    std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (pvVar6,&local_54c);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_360);
  poVar4 = std::operator<<(local_350,"Failed to assert condition ");
  poVar4 = std::operator<<(poVar4,"is_not_paired(p) && is_not_paired(q)");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"at (");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                          );
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = std::operator<<(poVar4,"connect_cps");
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x11b);
  std::operator<<(poVar4,") \n ");
  local_381 = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar5,local_380);
  local_381 = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::connect_cps(int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ASSERT(index(p) == index(q)+1);
  ASSERT(is_not_paired(p) && is_not_paired(q));
  ASSERT(m_des_conn[p].count(q) == m_asc_conn[q].count(p));

  m_des_conn[p].insert(q);
  m_asc_conn[q].insert(p);
}